

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O3

int __thiscall
CaDiCaL::Internal::elim_round(Internal *this,bool *completed,bool *deleted_binary_clause)

{
  byte *pbVar1;
  int64_t *piVar2;
  anon_struct_8_2_4505284c_for_terminate *paVar3;
  long *plVar4;
  vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *this_00;
  undefined1 *puVar5;
  int iVar6;
  Flags FVar7;
  pointer ppCVar8;
  Clause *pCVar9;
  pointer pFVar10;
  pointer puVar11;
  Clause **ppCVar12;
  iterator __position;
  int64_t iVar13;
  int64_t iVar14;
  Terminator *pTVar15;
  double dVar16;
  bool *deleted_binary_clause_00;
  uint *puVar17;
  uint *puVar18;
  bool bVar19;
  byte bVar20;
  char cVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  time_t *__timer;
  Internal *pIVar28;
  bool bVar29;
  Clause *__range3;
  long lVar30;
  int idx;
  pointer ppCVar31;
  ulong uVar32;
  Clause **__args;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar33;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Instantiator instantiator;
  Eliminator eliminator;
  int local_150;
  Instantiator local_148;
  long local_128;
  bool *local_120;
  int64_t local_118;
  bool *local_110;
  uint *local_108;
  uint *local_100;
  long local_f8;
  Eliminator local_f0;
  
  local_120 = deleted_binary_clause;
  time(this,(time_t *)completed);
  dVar16 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pIVar28 = this->internal;
  iVar6 = (pIVar28->opts).profile;
  if ((this->preprocessing == false) && (this->lookingahead == false)) {
    bVar20 = this->stable;
    if (((bool)bVar20 == true) && ((pIVar28->profiles).stable.level <= iVar6)) {
      stop_profiling(pIVar28,&(pIVar28->profiles).stable,dVar16);
      bVar20 = this->stable;
      pIVar28 = this->internal;
    }
    if (((bVar20 & 1) == 0) && ((pIVar28->profiles).unstable.level <= iVar6)) {
      stop_profiling(pIVar28,&(pIVar28->profiles).unstable,dVar16);
      pIVar28 = this->internal;
    }
    if ((pIVar28->profiles).search.level <= iVar6) {
      stop_profiling(pIVar28,&(pIVar28->profiles).search,dVar16);
      pIVar28 = this->internal;
    }
    pbVar1 = (byte *)((long)&this->mode + 1);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if ((pIVar28->profiles).simplify.level <= iVar6) {
    start_profiling(pIVar28,&(pIVar28->profiles).simplify,dVar16);
    pIVar28 = this->internal;
  }
  if ((pIVar28->profiles).elim.level <= iVar6) {
    start_profiling(pIVar28,&(pIVar28->profiles).elim,dVar16);
  }
  this->mode = this->mode | 0x220;
  lVar26 = (this->stats).elimrounds + 1;
  (this->stats).elimrounds = lVar26;
  (this->last).elim.marked = (this->stats).mark.elim;
  if ((this->opts).elimlimited == 0) {
    lVar23 = 0x7fffffffffffffff;
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-round",lVar26,"resolutions unlimited");
    }
  }
  else {
    lVar23 = (long)((double)(this->stats).propagations.search *
                   (double)(this->opts).elimreleff * 0.001);
    lVar25 = (long)(this->opts).elimineff;
    if (lVar25 < lVar23) {
      lVar25 = lVar23;
    }
    lVar23 = (long)(this->opts).elimaxeff;
    if (lVar23 <= lVar25) {
      lVar25 = lVar23;
    }
    lVar30 = (long)(int)(this->stats).active;
    lVar23 = lVar30 * 2;
    if (lVar25 != lVar23 && SBORROW8(lVar25,lVar23) == lVar25 + lVar30 * -2 < 0) {
      lVar23 = lVar25;
    }
    if (this->internal != (Internal *)0x0) {
      phase(this->internal,"elim-round",lVar26,"limit of %ld resolutions");
    }
    lVar23 = lVar23 + (this->stats).elimres;
  }
  init_noccs(this);
  ppCVar8 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar31 = (this->clauses).
                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar31 != ppCVar8; ppCVar31 = ppCVar31 + 1) {
    pCVar9 = *ppCVar31;
    if ((*(ushort *)&pCVar9->field_0x8 & 0x810) == 0) {
      iVar6 = pCVar9->size;
      if ((long)iVar6 != 0) {
        lVar26 = (long)iVar6 << 2;
        lVar25 = 0;
        bVar20 = 0;
        bVar19 = false;
        do {
          bVar29 = bVar19;
          cVar21 = this->vals[*(int *)((long)&pCVar9[1].field_0 + lVar25)];
          if (cVar21 < '\x01') {
            bVar20 = cVar21 < '\0' | bVar20;
          }
          lVar25 = lVar25 + 4;
          bVar19 = (bool)(bVar29 | '\0' < cVar21);
        } while (lVar26 != lVar25);
        if (bVar29 || '\0' < cVar21) {
          mark_garbage(this,pCVar9);
        }
        else if (iVar6 != 0) {
          lVar25 = 0;
          do {
            uVar27 = *(uint *)((long)&pCVar9[1].field_0 + lVar25);
            uVar22 = -uVar27;
            if (0 < (int)uVar27) {
              uVar22 = uVar27;
            }
            pFVar10 = (this->ftab).
                      super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
                      super__Vector_impl_data._M_start;
            FVar7 = pFVar10[uVar22];
            if (((uint)FVar7 & 0x7000000) == 0x1000000) {
              if (((FVar7._1_1_ | ~bVar20) & 1) == 0) {
                piVar2 = &(this->stats).mark.elim;
                *piVar2 = *piVar2 + 1;
                puVar5 = &pFVar10[uVar22].field_0x1;
                *puVar5 = *puVar5 | 1;
                uVar27 = *(uint *)((long)&pCVar9[1].field_0 + lVar25);
                uVar22 = -uVar27;
                if (0 < (int)uVar27) {
                  uVar22 = uVar27;
                }
              }
              plVar4 = (this->ntab).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + (uVar22 << 1 | uVar27 >> 0x1f);
              *plVar4 = *plVar4 + 1;
            }
            lVar25 = lVar25 + 4;
          } while (lVar26 != lVar25);
        }
      }
    }
  }
  init_occs(this);
  Eliminator::Eliminator(&local_f0,this);
  uVar27 = *(this->vars).n;
  if (uVar27 != 0) {
    uVar32 = 1;
    do {
      uVar22 = (uint)uVar32;
      uVar24 = (ulong)-uVar22;
      if (0 < (int)uVar22) {
        uVar24 = uVar32;
      }
      pFVar10 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                _M_impl.super__Vector_impl_data._M_start;
      FVar7 = pFVar10[uVar24];
      if (((uint)FVar7 & 0x7000000) == 0x1000000) {
        puVar11 = (this->frozentab).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar24 < (ulong)((long)(this->frozentab).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 2))
        {
          if ((((uint)FVar7 >> 8 & 1) != 0) && (puVar11[uVar24] == 0)) {
LAB_007ff155:
            pFVar10[uVar24] = (Flags)((uint)FVar7 & 0xf9fffeff);
            heap<CaDiCaL::elim_more>::push_back(&local_f0.schedule,uVar22);
          }
        }
        else if (((uint)FVar7 >> 8 & 1) != 0) goto LAB_007ff155;
      }
      uVar32 = (ulong)(uVar22 + 1);
    } while (uVar22 != uVar27);
  }
  shrink_vector<unsigned_int>(&local_f0.schedule.array);
  shrink_vector<unsigned_int>(&local_f0.schedule.pos);
  local_108 = local_f0.schedule.array.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_100 = local_f0.schedule.array.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_128 = (long)local_f0.schedule.array.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f0.schedule.array.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  if (this->internal != (Internal *)0x0) {
    iVar6 = (int)(this->stats).active;
    uVar33 = 0;
    if (iVar6 != 0) {
      uVar33 = SUB84(((double)local_128 * 100.0) / (double)iVar6,0);
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "scheduled %ld variables %.0f%% for elimination",uVar33,local_128);
  }
  ppCVar12 = (this->clauses).
             super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_110 = completed;
  local_f8 = lVar23;
  deleted_binary_clause_00 = local_120;
  for (__args = (this->clauses).
                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_start; local_120 = deleted_binary_clause_00,
      __args != ppCVar12; __args = __args + 1) {
    pCVar9 = *__args;
    if (((*(ushort *)&pCVar9->field_0x8 & 0x810) == 0) && (iVar6 = pCVar9->size, (long)iVar6 != 0))
    {
      lVar26 = 0;
      do {
        uVar27 = *(uint *)((long)&pCVar9[1].field_0 + lVar26);
        uVar22 = -uVar27;
        if (0 < (int)uVar27) {
          uVar22 = uVar27;
        }
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar22] & 0x7000000) == 0x1000000) {
          this_00 = (vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *)
                    ((this->otab).
                     super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (uVar22 << 1 | uVar27 >> 0x1f));
          __position._M_current = *(Clause ***)(this_00 + 8);
          if (__position._M_current == *(Clause ***)(this_00 + 0x10)) {
            std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
            _M_realloc_insert<CaDiCaL::Clause*const&>(this_00,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        lVar26 = lVar26 + 4;
      } while ((long)iVar6 * 4 != lVar26);
    }
    deleted_binary_clause_00 = local_120;
  }
  local_118 = (this->stats).elimres;
  lVar26 = (this->stats).irrlits;
  iVar13 = (this->stats).all.eliminated;
  iVar14 = (this->stats).all.fixed;
  if (this->unsat == false) {
    lVar23 = 0;
    while (lVar25 = local_f8, this->termination_forced == false) {
      iVar6 = (this->lim).terminate.forced;
      if ((iVar6 != 0) && ((this->lim).terminate.forced = iVar6 + -1, iVar6 == 1)) {
LAB_007ff763:
        this->termination_forced = true;
        break;
      }
      pTVar15 = this->external->terminator;
      if (pTVar15 != (Terminator *)0x0) {
        paVar3 = &(this->lim).terminate;
        iVar6 = paVar3->check;
        paVar3->check = paVar3->check + -1;
        if (iVar6 == 0) {
          (this->lim).terminate.check = (this->opts).terminateint;
          cVar21 = (**(code **)(*(long *)pTVar15 + 0x10))();
          if (cVar21 != '\0') goto LAB_007ff763;
        }
      }
      if ((lVar25 < (this->stats).elimres) ||
         (local_f0.schedule.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_f0.schedule.array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish)) break;
      uVar27 = *local_f0.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      heap<CaDiCaL::elim_more>::pop_front(&local_f0.schedule);
      uVar22 = -uVar27;
      if (0 < (int)uVar27) {
        uVar22 = uVar27;
      }
      pFVar10 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar22;
      *pFVar10 = (Flags)((uint)*pFVar10 & 0xfffffeff);
      try_to_eliminate_variable(this,&local_f0,uVar27,deleted_binary_clause_00);
      if ((lVar26 * 2) / 3 + 0x100000 < (this->stats).garbage.literals) {
        mark_redundant_clauses_with_eliminated_variables_as_garbage(this);
        garbage_collection(this);
      }
      lVar23 = lVar23 + 1;
      if (this->unsat == true) break;
    }
  }
  else {
    lVar23 = 0;
  }
  puVar18 = local_100;
  puVar17 = local_108;
  *local_110 = (long)local_f0.schedule.array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f0.schedule.array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start == 0;
  if (this->internal != (Internal *)0x0) {
    uVar33 = 0;
    if (local_108 != local_100) {
      uVar33 = SUB84(((double)lVar23 * 100.0) / (double)local_128,0);
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "tried to eliminate %ld variables %.0f%% (%zd remain)",uVar33,lVar23,
          (long)local_f0.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.schedule.array.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2);
  }
  heap<CaDiCaL::elim_more>::erase(&local_f0.schedule);
  local_148.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.candidates.
  super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->unsat == false) && (this->termination_forced == false)) {
    iVar6 = (this->lim).terminate.forced;
    if ((iVar6 == 0) || ((this->lim).terminate.forced = iVar6 + -1, iVar6 != 1)) {
      pTVar15 = this->external->terminator;
      if (pTVar15 != (Terminator *)0x0) {
        paVar3 = &(this->lim).terminate;
        iVar6 = paVar3->check;
        paVar3->check = paVar3->check + -1;
        if (iVar6 == 0) {
          (this->lim).terminate.check = (this->opts).terminateint;
          cVar21 = (**(code **)(*(long *)pTVar15 + 0x10))();
          if (cVar21 != '\0') goto LAB_007ff3fc;
        }
      }
      if ((this->opts).instantiate != 0) {
        collect_instantiation_candidates(this,&local_148);
      }
    }
    else {
LAB_007ff3fc:
      this->termination_forced = true;
    }
  }
  reset_occs(this);
  reset_noccs(this);
  if (this->unsat == false) {
    mark_redundant_clauses_with_eliminated_variables_as_garbage(this);
  }
  local_150 = (int)iVar13;
  uVar27 = (int)(this->stats).all.eliminated - local_150;
  if (this->internal != (Internal *)0x0) {
    uVar33 = 0;
    if (puVar17 != puVar18) {
      uVar33 = SUB84(((double)(int)uVar27 * 100.0) / (double)local_128,0);
    }
    phase(this->internal,"elim-round",(this->stats).elimrounds,
          "eliminated %d variables %.0f%% in %ld resolutions",uVar33,(ulong)uVar27,
          (this->stats).elimres - local_118);
  }
  (this->last).elim.subsumephases = (this->stats).subsumephases;
  __timer = (time_t *)0x65;
  report(this,'e',(uint)((int)iVar14 - (int)(this->stats).all.fixed == uVar27 &&
                        (this->opts).reportall == 0));
  time(this,__timer);
  dVar16 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  pIVar28 = this->internal;
  iVar6 = (pIVar28->opts).profile;
  if ((pIVar28->profiles).elim.level <= iVar6) {
    stop_profiling(pIVar28,&(pIVar28->profiles).elim,dVar16);
    pIVar28 = this->internal;
  }
  if ((pIVar28->profiles).simplify.level <= iVar6) {
    stop_profiling(pIVar28,&(pIVar28->profiles).simplify,dVar16);
  }
  this->mode = this->mode & 0xfffffddf;
  if ((this->preprocessing == false) && (this->lookingahead == false)) {
    pIVar28 = this->internal;
    if ((pIVar28->profiles).search.level <= iVar6) {
      start_profiling(pIVar28,&(pIVar28->profiles).search,dVar16);
    }
    bVar20 = this->stable;
    if (((bool)bVar20 == true) &&
       (pIVar28 = this->internal, (pIVar28->profiles).stable.level <= iVar6)) {
      start_profiling(pIVar28,&(pIVar28->profiles).stable,dVar16);
      bVar20 = this->stable;
    }
    if (((bVar20 & 1) == 0) &&
       (pIVar28 = this->internal, (pIVar28->profiles).unstable.level <= iVar6)) {
      start_profiling(pIVar28,&(pIVar28->profiles).unstable,dVar16);
    }
    pbVar1 = (byte *)((long)&this->mode + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((this->unsat != false) || (this->termination_forced != false)) goto LAB_007ff733;
  iVar6 = (this->lim).terminate.forced;
  if ((iVar6 == 0) || ((this->lim).terminate.forced = iVar6 + -1, iVar6 != 1)) {
    pTVar15 = this->external->terminator;
    if (pTVar15 != (Terminator *)0x0) {
      paVar3 = &(this->lim).terminate;
      iVar6 = paVar3->check;
      paVar3->check = paVar3->check + -1;
      if (iVar6 == 0) {
        (this->lim).terminate.check = (this->opts).terminateint;
        cVar21 = (**(code **)(*(long *)pTVar15 + 0x10))();
        if (cVar21 != '\0') goto LAB_007ff70c;
      }
    }
    if (local_148.candidates.
        super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_148.candidates.
        super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      instantiate(this,&local_148);
    }
  }
  else {
LAB_007ff70c:
    this->termination_forced = true;
  }
LAB_007ff733:
  if (local_148.candidates.
      super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.candidates.
                    super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.candidates.
                          super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.candidates.
                          super__Vector_base<CaDiCaL::Instantiator::Candidate,_std::allocator<CaDiCaL::Instantiator::Candidate>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Eliminator::~Eliminator(&local_f0);
  return uVar27;
}

Assistant:

int Internal::elim_round (bool &completed, bool &deleted_binary_clause) {

  assert (opts.elim);
  assert (!unsat);

  START_SIMPLIFIER (elim, ELIM);
  stats.elimrounds++;

  last.elim.marked = stats.mark.elim;
  assert (!level);

  int64_t resolution_limit;

  if (opts.elimlimited) {
    int64_t delta = stats.propagations.search;
    delta *= 1e-3 * opts.elimreleff;
    if (delta < opts.elimineff)
      delta = opts.elimineff;
    if (delta > opts.elimaxeff)
      delta = opts.elimaxeff;
    delta = max (delta, (int64_t) 2l * active ());

    PHASE ("elim-round", stats.elimrounds,
           "limit of %" PRId64 " resolutions", delta);

    resolution_limit = stats.elimres + delta;
  } else {
    PHASE ("elim-round", stats.elimrounds, "resolutions unlimited");
    resolution_limit = LONG_MAX;
  }

  init_noccs ();

  // First compute the number of occurrences of each literal and at the same
  // time mark satisfied clauses and update 'elim' flags of variables in
  // clauses with root level assigned literals (both false and true).
  //
  for (const auto &c : clauses) {
    if (c->garbage || c->redundant)
      continue;
    bool satisfied = false, falsified = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0)
        satisfied = true;
      else if (tmp < 0)
        falsified = true;
      else
        assert (active (lit));
    }
    if (satisfied)
      mark_garbage (c); // forces more precise counts
    else {
      for (const auto &lit : *c) {
        if (!active (lit))
          continue;
        if (falsified)
          mark_elim (lit); // simulate unit propagation
        noccs (lit)++;
      }
    }
  }

  init_occs ();

  Eliminator eliminator (this);
  ElimSchedule &schedule = eliminator.schedule;

  // Now find elimination candidates which occurred in clauses removed since
  // the last time we ran bounded variable elimination, which in turned
  // triggered their 'elim' bit to be set.
  //
  for (auto idx : vars) {
    if (!active (idx))
      continue;
    if (frozen (idx))
      continue;
    if (!flags (idx).elim)
      continue;
    flags (idx).elim = false;
    LOG ("scheduling %d for elimination initially", idx);
    schedule.push_back (idx);
  }

  schedule.shrink ();

#ifndef QUIET
  int64_t scheduled = schedule.size ();
#endif

  PHASE ("elim-round", stats.elimrounds,
         "scheduled %" PRId64 " variables %.0f%% for elimination",
         scheduled, percent (scheduled, active ()));

  // Connect irredundant clauses.
  //
  for (const auto &c : clauses)
    if (!c->garbage && !c->redundant)
      for (const auto &lit : *c)
        if (active (lit))
          occs (lit).push_back (c);

#ifndef QUIET
  const int64_t old_resolutions = stats.elimres;
#endif
  const int old_eliminated = stats.all.eliminated;
  const int old_fixed = stats.all.fixed;

  // Limit on garbage literals during variable elimination. If the limit is
  // hit a garbage collection is performed.
  //
  const int64_t garbage_limit = (2 * stats.irrlits / 3) + (1 << 20);

  // Main loops tries to eliminate variables according to the schedule. The
  // schedule is updated dynamically and variables are potentially
  // rescheduled to be tried again if they occur in a removed clause.
  //
#ifndef QUIET
  int64_t tried = 0;
#endif
  while (!unsat && !terminated_asynchronously () &&
         stats.elimres <= resolution_limit && !schedule.empty ()) {
    int idx = schedule.front ();
    schedule.pop_front ();
    flags (idx).elim = false;
    try_to_eliminate_variable (eliminator, idx, deleted_binary_clause);
#ifndef QUIET
    tried++;
#endif
    if (stats.garbage.literals <= garbage_limit)
      continue;
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();
    garbage_collection ();
  }

  // If the schedule is empty all variables have been tried (even
  // rescheduled ones).  Otherwise asynchronous termination happened or we
  // ran into the resolution limit (or derived unsatisfiability).
  //
  completed = !schedule.size ();

  PHASE ("elim-round", stats.elimrounds,
         "tried to eliminate %" PRId64 " variables %.0f%% (%zd remain)",
         tried, percent (tried, scheduled), schedule.size ());

  schedule.erase ();

  // Collect potential literal clause instantiation pairs, which needs full
  // occurrence lists and thus we have it here before resetting them.
  //
  Instantiator instantiator;
  if (!unsat && !terminated_asynchronously () && opts.instantiate)
    collect_instantiation_candidates (instantiator);

  reset_occs ();
  reset_noccs ();

  // Mark all redundant clauses with eliminated variables as garbage.
  //
  if (!unsat)
    mark_redundant_clauses_with_eliminated_variables_as_garbage ();

  int eliminated = stats.all.eliminated - old_eliminated;
#ifndef QUIET
  int64_t resolutions = stats.elimres - old_resolutions;
  PHASE ("elim-round", stats.elimrounds,
         "eliminated %d variables %.0f%% in %" PRId64 " resolutions",
         eliminated, percent (eliminated, scheduled), resolutions);
#endif

  last.elim.subsumephases = stats.subsumephases;
  const int units = stats.all.fixed - old_fixed;
  report ('e', !opts.reportall && !(eliminated + units));
  STOP_SIMPLIFIER (elim, ELIM);

  if (!unsat && !terminated_asynchronously () &&
      instantiator) // Do we have candidate pairs?
    instantiate (instantiator);

  return eliminated; // non-zero if successful
}